

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bech32_api_tests.cpp
# Opt level: O2

void encode_c1_minimalExample_isSuccessful(void)

{
  __type _Var1;
  string expected;
  string hrp;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  string local_48;
  string local_28;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,"a",(allocator<char> *)&local_68);
  local_88._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_88._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"a12uel5l",(allocator<char> *)&local_48);
  bech32::encodeUsingOriginalConstant
            (&local_48,&local_28,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_88)
  ;
  _Var1 = std::operator==(&local_68,&local_48);
  if (_Var1) {
    std::__cxx11::string::~string((string *)&local_48);
    std::__cxx11::string::~string((string *)&local_68);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_88);
    std::__cxx11::string::~string((string *)&local_28);
    return;
  }
  __assert_fail("expected == bech32::encodeUsingOriginalConstant(hrp, dp)",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/dcdpr[P]libbech32/test/testbech32/bech32_api_tests.cpp"
                ,0xc1,"void encode_c1_minimalExample_isSuccessful()");
}

Assistant:

void encode_c1_minimalExample_isSuccessful() {
    std::string hrp = "a";
    std::vector<unsigned char> dp = {};
    std::string expected = "a12uel5l";

    assert(expected == bech32::encodeUsingOriginalConstant(hrp, dp));
}